

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigCreateClasses(Ivy_FraigMan_t *p)

{
  Ivy_Obj_t *pNext;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Ivy_Obj_t *pIVar4;
  void *__s;
  Ivy_Obj_t *pIVar5;
  uint Hash;
  int nTableSize;
  int i;
  Ivy_Obj_t *pEntry;
  Ivy_Obj_t *pBin;
  Ivy_Obj_t *pConst1;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t **pTable;
  Ivy_FraigMan_t *p_local;
  
  pIVar4 = Ivy_ManConst1(p->pManAig);
  iVar1 = Ivy_ManObjNum(p->pManAig);
  uVar2 = iVar1 / 2 + 0xd;
  __s = malloc((long)(int)uVar2 << 3);
  memset(__s,0,(long)(int)uVar2 << 3);
  Hash = 0;
  do {
    iVar1 = Vec_PtrSize(p->pManAig->vObjs);
    if (iVar1 <= (int)Hash) {
      if ((p->lClasses).pHead != (Ivy_Obj_t *)0x0) {
        __assert_fail("p->lClasses.pHead == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                      ,0x4bb,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
      }
      Hash = 0;
      do {
        iVar1 = Vec_PtrSize(p->pManAig->vObjs);
        if (iVar1 <= (int)Hash) {
          if (__s != (void *)0x0) {
            free(__s);
          }
          return;
        }
        pIVar4 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,Hash);
        if ((pIVar4 != (Ivy_Obj_t *)0x0) &&
           (((iVar1 = Ivy_ObjIsConst1(pIVar4), iVar1 != 0 ||
             (iVar1 = Ivy_ObjIsPi(pIVar4), iVar1 != 0)) ||
            (iVar1 = Ivy_ObjIsNode(pIVar4), iVar1 != 0)))) {
          Ivy_ObjSetNodeHashNext(pIVar4,(Ivy_Obj_t *)0x0);
          pIVar5 = Ivy_ObjClassNodeRepr(pIVar4);
          if (pIVar5 == (Ivy_Obj_t *)0x0) {
            pIVar4 = Ivy_ObjClassNodeNext(pIVar4);
            if (pIVar4 != (Ivy_Obj_t *)0x0) {
              __assert_fail("Ivy_ObjClassNodeNext(pObj) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                            ,0x4c3,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
            }
          }
          else {
            pIVar5 = Ivy_ObjClassNodeRepr(pIVar4);
            pIVar5 = Ivy_ObjClassNodeNext(pIVar5);
            if (pIVar5 == (Ivy_Obj_t *)0x0) {
              Ivy_ObjSetClassNodeRepr(pIVar4,(Ivy_Obj_t *)0x0);
              Ivy_FraigAddClass(&p->lClasses,pIVar4);
            }
          }
        }
        Hash = Hash + 1;
      } while( true );
    }
    pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,Hash);
    if ((pIVar5 != (Ivy_Obj_t *)0x0) &&
       ((iVar1 = Ivy_ObjIsPi(pIVar5), iVar1 != 0 || (iVar1 = Ivy_ObjIsNode(pIVar5), iVar1 != 0)))) {
      uVar3 = Ivy_NodeHash(p,pIVar5);
      if ((uVar3 == 0) && (iVar1 = Ivy_NodeHasZeroSim(p,pIVar5), iVar1 != 0)) {
        Ivy_NodeAddToClass(pIVar4,pIVar5);
      }
      else {
        pNext = *(Ivy_Obj_t **)((long)__s + ((ulong)uVar3 % (ulong)uVar2) * 8);
        for (_nTableSize = pNext; _nTableSize != (Ivy_Obj_t *)0x0;
            _nTableSize = Ivy_ObjNodeHashNext(_nTableSize)) {
          iVar1 = Ivy_NodeCompareSims(p,_nTableSize,pIVar5);
          if (iVar1 != 0) {
            Ivy_NodeAddToClass(_nTableSize,pIVar5);
            break;
          }
        }
        if (_nTableSize == (Ivy_Obj_t *)0x0) {
          Ivy_ObjSetNodeHashNext(pIVar5,pNext);
          *(Ivy_Obj_t **)((long)__s + ((ulong)uVar3 % (ulong)uVar2) * 8) = pIVar5;
        }
      }
    }
    Hash = Hash + 1;
  } while( true );
}

Assistant:

void Ivy_FraigCreateClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t ** pTable;
    Ivy_Obj_t * pObj, * pConst1, * pBin, * pEntry;
    int i, nTableSize;
    unsigned Hash;
    pConst1 = Ivy_ManConst1(p->pManAig);
    // allocate the table
    nTableSize = Ivy_ManObjNum(p->pManAig) / 2 + 13;
    pTable = ABC_ALLOC( Ivy_Obj_t *, nTableSize ); 
    memset( pTable, 0, sizeof(Ivy_Obj_t *) * nTableSize );
    // collect nodes into the table
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Hash = Ivy_NodeHash( p, pObj );
        if ( Hash == 0 && Ivy_NodeHasZeroSim( p, pObj ) )
        {
            Ivy_NodeAddToClass( pConst1, pObj );
            continue;
        }
        // add the node to the table
        pBin = pTable[Hash % nTableSize];
        Ivy_FraigForEachBinNode( pBin, pEntry )
            if ( Ivy_NodeCompareSims( p, pEntry, pObj ) )
            {
                Ivy_NodeAddToClass( pEntry, pObj );
                break;
            }
        // check if the entry was added
        if ( pEntry )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, pBin );
        pTable[Hash % nTableSize] = pObj;
    }
    // collect non-trivial classes
    assert( p->lClasses.pHead == NULL );
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsConst1(pObj) && !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, NULL );
        if ( Ivy_ObjClassNodeRepr(pObj) == NULL )
        {
            assert( Ivy_ObjClassNodeNext(pObj) == NULL );
            continue;
        }
        // recognize the head of the class
        if ( Ivy_ObjClassNodeNext( Ivy_ObjClassNodeRepr(pObj) ) != NULL )
            continue;
        // clean the class representative and add it to the list
        Ivy_ObjSetClassNodeRepr( pObj, NULL );
        Ivy_FraigAddClass( &p->lClasses, pObj );
    }
    // free the table
    ABC_FREE( pTable );
}